

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
eigenSolver(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
           vector<double,_std::allocator<double>_> *coeffA)

{
  PointerType dataPtr;
  PointerType dataPtr_00;
  ostream *poVar1;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> mapRR;
  VectorXd coeff;
  PolynomialSolver<double,__1> psolve;
  MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0> local_150;
  void *local_138 [2];
  PointerType local_128;
  long lStack_120;
  undefined1 local_118;
  PolynomialSolver<double,__1> local_110;
  
  if ((coeffA->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (coeffA->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"eigen solver begin");
    std::endl<char,std::char_traits<char>>(poVar1);
    dataPtr = (coeffA->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Eigen::
    MapBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::
    MapBase((MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             *)&local_110,dataPtr,
            (long)(coeffA->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)dataPtr >> 3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_138,
               (DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&local_110);
    Eigen::PolynomialSolver<double,-1>::PolynomialSolver<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PolynomialSolver<double,_1> *)&local_110,
               (Matrix<double,__1,_1,_0,__1,_1> *)local_138);
    poVar1 = std::operator<<((ostream *)&std::cout,"Complex roots: ");
    local_150.m_data = (PointerType)&local_110;
    poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Transpose<const_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>_>
                                       *)&local_150);
    std::endl<char,std::char_traits<char>>(poVar1);
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_150.m_data = (PointerType)0x3d719799812dea11;
    Eigen::PolynomialSolverBase<double,-1>::realRoots<std::vector<double,std::allocator<double>>>
              ((PolynomialSolverBase<double,_1> *)&local_110,__return_storage_ptr__,
               (RealScalar *)&local_150);
    dataPtr_00 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    Eigen::MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::
    MapBase(&local_150,dataPtr_00,
            (long)(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)dataPtr_00 >> 3);
    poVar1 = std::operator<<((ostream *)&std::cout,"Real roots: ");
    local_118 = local_150._16_1_;
    local_128 = local_150.m_data;
    lStack_120 = local_150.m_rows.m_value;
    poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                                       *)&local_128);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"eigen solver end");
    std::endl<char,std::char_traits<char>>(poVar1);
    Eigen::PolynomialSolver<double,_-1>::~PolynomialSolver(&local_110);
    free(local_138[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> eigenSolver(const std::vector<double>& coeffA)
{
    if (coeffA.empty())
        return {};

    std::cout<<"eigen solver begin"<<std::endl;
    using namespace Eigen;
    VectorXd coeff =  VectorXd::Map(coeffA.data(), coeffA.size());

    Eigen::PolynomialSolver<double, Eigen::Dynamic> psolve(coeff);
    std::cout << "Complex roots: " << psolve.roots().transpose() << std::endl;
    std::vector<double> realRoots;
    psolve.realRoots( realRoots );
    Map<VectorXd> mapRR(realRoots.data(), realRoots.size());
    std::cout << "Real roots: " << mapRR.transpose() << std::endl;
    std::cout<<"eigen solver end"<<std::endl;
    return realRoots;
}